

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_attribute_corner_table.cc
# Opt level: O2

bool __thiscall
draco::MeshAttributeCornerTable::InitFromAttribute
          (MeshAttributeCornerTable *this,Mesh *mesh,CornerTable *table,PointAttribute *att)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  pointer pIVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  CornerTable *pCVar9;
  ulong __n;
  int iVar10;
  ulong uVar11;
  size_type sVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  ulong __n_00;
  reference rVar16;
  
  bVar2 = InitEmpty(this,table);
  if (bVar2) {
    ValenceCache<draco::MeshAttributeCornerTable>::ClearValenceCache(&this->valence_cache_);
    ValenceCache<draco::MeshAttributeCornerTable>::ClearValenceCacheInaccurate
              (&this->valence_cache_);
    this_00 = &this->is_vertex_on_seam_;
    for (__n_00 = 0; pCVar9 = this->corner_table_,
        __n_00 < ((ulong)((long)(pCVar9->corner_to_vertex_map_).vector_.
                                super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pCVar9->corner_to_vertex_map_).vector_.
                               super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff);
        __n_00 = __n_00 + 1) {
      bVar3 = CornerTable::IsDegenerated(pCVar9,(FaceIndex)(uint)((__n_00 & 0xffffffff) / 3));
      if (!bVar3) {
        uVar5 = (this->corner_table_->opposite_corners_).vector_.
                super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[__n_00].value_;
        __n = (ulong)uVar5;
        uVar8 = (uint)__n_00;
        if (__n == 0xffffffff) {
          rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&this->is_edge_on_seam_,__n_00);
          *rVar16._M_p = *rVar16._M_p | rVar16._M_mask;
          uVar5 = uVar8 - 2;
          if ((uVar8 + 1) % 3 != 0) {
            uVar5 = uVar8 + 1;
          }
          sVar12 = 0xffffffff;
          if (uVar5 != 0xffffffff) {
            sVar12 = (size_type)
                     (this->corner_table_->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar5].value_;
          }
          rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,sVar12);
          *rVar16._M_p = *rVar16._M_p | rVar16._M_mask;
          pCVar9 = this->corner_table_;
          uVar5 = uVar8;
          if ((int)((__n_00 & 0xffffffff) % 3) == 0) goto LAB_0012bece;
          uVar5 = uVar8 - 1;
LAB_0012bed8:
          sVar12 = (size_type)
                   (pCVar9->corner_to_vertex_map_).vector_.
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar5].value_;
        }
        else {
          if (__n < __n_00) goto LAB_0012beed;
          iVar14 = 3;
          uVar11 = __n_00 & 0xffffffff;
          uVar13 = uVar5;
          do {
            iVar14 = iVar14 + -1;
            if (iVar14 == 0) goto LAB_0012beed;
            iVar10 = (int)uVar11;
            uVar7 = 0xffffffff;
            if ((iVar10 != -1) && (uVar7 = iVar10 + 1, uVar7 % 3 == 0)) {
              uVar7 = iVar10 - 2;
            }
            uVar15 = 0xffffffff;
            if (uVar13 != 0xffffffff) {
              if (uVar13 % 3 == 0) {
                uVar15 = uVar13 + 2;
              }
              else {
                uVar15 = uVar13 - 1;
              }
            }
            uVar13 = uVar15;
            uVar11 = 0xffffffff;
            if (-1 < (int)uVar7) {
              uVar11 = (ulong)(mesh->faces_).vector_.
                              super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[(ulong)uVar7 / 3]._M_elems
                              [(ulong)uVar7 % 3].value_;
            }
            uVar15 = (uint)uVar11;
            uVar6 = 0xffffffff;
            if (-1 < (int)uVar13) {
              uVar6 = (ulong)(mesh->faces_).vector_.
                             super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[(ulong)uVar13 / 3]._M_elems
                             [(ulong)uVar13 % 3].value_;
            }
            uVar4 = (uint)uVar6;
            if (att->identity_mapping_ == false) {
              pIVar1 = (att->indices_map_).vector_.
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar15 = pIVar1[uVar11].value_;
              uVar4 = pIVar1[uVar6].value_;
            }
            uVar11 = (ulong)uVar7;
          } while (uVar15 == uVar4);
          this->no_interior_seams_ = false;
          rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&this->is_edge_on_seam_,__n_00);
          *rVar16._M_p = *rVar16._M_p | rVar16._M_mask;
          rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->is_edge_on_seam_,__n)
          ;
          *rVar16._M_p = *rVar16._M_p | rVar16._M_mask;
          uVar13 = uVar8 - 2;
          if ((uVar8 + 1) % 3 != 0) {
            uVar13 = uVar8 + 1;
          }
          sVar12 = 0xffffffff;
          if (uVar13 != 0xffffffff) {
            sVar12 = (size_type)
                     (this->corner_table_->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar13].value_;
          }
          rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,sVar12);
          *rVar16._M_p = *rVar16._M_p | rVar16._M_mask;
          if ((int)((__n_00 & 0xffffffff) % 3) == 0) {
            uVar8 = uVar8 + 2;
            sVar12 = 0xffffffff;
            if (uVar8 != 0xffffffff) goto LAB_0012be69;
          }
          else {
            uVar8 = uVar8 - 1;
LAB_0012be69:
            sVar12 = (size_type)
                     (this->corner_table_->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar8].value_;
          }
          rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,sVar12);
          *rVar16._M_p = *rVar16._M_p | rVar16._M_mask;
          uVar8 = uVar5 - 2;
          if ((uVar5 + 1) % 3 != 0) {
            uVar8 = uVar5 + 1;
          }
          sVar12 = 0xffffffff;
          if (uVar8 != 0xffffffff) {
            sVar12 = (size_type)
                     (this->corner_table_->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar8].value_;
          }
          rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,sVar12);
          *rVar16._M_p = *rVar16._M_p | rVar16._M_mask;
          pCVar9 = this->corner_table_;
          if (uVar5 % 3 != 0) {
            uVar5 = uVar5 - 1;
            goto LAB_0012bed8;
          }
LAB_0012bece:
          uVar5 = uVar5 + 2;
          sVar12 = 0xffffffff;
          if (uVar5 != 0xffffffff) goto LAB_0012bed8;
        }
        rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,sVar12);
        *rVar16._M_p = *rVar16._M_p | rVar16._M_mask;
      }
LAB_0012beed:
    }
    RecomputeVertices(this,mesh,att);
  }
  return bVar2;
}

Assistant:

bool MeshAttributeCornerTable::InitFromAttribute(const Mesh *mesh,
                                                 const CornerTable *table,
                                                 const PointAttribute *att) {
  if (!InitEmpty(table)) {
    return false;
  }
  valence_cache_.ClearValenceCache();
  valence_cache_.ClearValenceCacheInaccurate();

  // Find all necessary data for encoding attributes. For now we check which of
  // the mesh vertices is part of an attribute seam, because seams require
  // special handling.
  for (CornerIndex c(0); c < corner_table_->num_corners(); ++c) {
    const FaceIndex f = corner_table_->Face(c);
    if (corner_table_->IsDegenerated(f)) {
      continue;  // Ignore corners on degenerated faces.
    }
    const CornerIndex opp_corner = corner_table_->Opposite(c);
    if (opp_corner == kInvalidCornerIndex) {
      // Boundary. Mark it as seam edge.
      is_edge_on_seam_[c.value()] = true;
      // Mark seam vertices.
      VertexIndex v;
      v = corner_table_->Vertex(corner_table_->Next(c));
      is_vertex_on_seam_[v.value()] = true;
      v = corner_table_->Vertex(corner_table_->Previous(c));
      is_vertex_on_seam_[v.value()] = true;
      continue;
    }
    if (opp_corner < c) {
      continue;  // Opposite corner was already processed.
    }

    CornerIndex act_c(c), act_sibling_c(opp_corner);
    for (int i = 0; i < 2; ++i) {
      // Get the sibling corners. I.e., the two corners attached to the same
      // vertex but divided by the seam edge.
      act_c = corner_table_->Next(act_c);
      act_sibling_c = corner_table_->Previous(act_sibling_c);
      const PointIndex point_id = mesh->CornerToPointId(act_c.value());
      const PointIndex sibling_point_id =
          mesh->CornerToPointId(act_sibling_c.value());
      if (att->mapped_index(point_id) != att->mapped_index(sibling_point_id)) {
        no_interior_seams_ = false;
        is_edge_on_seam_[c.value()] = true;
        is_edge_on_seam_[opp_corner.value()] = true;
        // Mark seam vertices.
        is_vertex_on_seam_[corner_table_
                               ->Vertex(corner_table_->Next(CornerIndex(c)))
                               .value()] = true;
        is_vertex_on_seam_[corner_table_
                               ->Vertex(corner_table_->Previous(CornerIndex(c)))
                               .value()] = true;
        is_vertex_on_seam_
            [corner_table_->Vertex(corner_table_->Next(opp_corner)).value()] =
                true;
        is_vertex_on_seam_[corner_table_
                               ->Vertex(corner_table_->Previous(opp_corner))
                               .value()] = true;
        break;
      }
    }
  }
  RecomputeVertices(mesh, att);
  return true;
}